

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O3

void Fraig_ParamsSetDefault(Fraig_Params_t *pParams)

{
  pParams->nPatsRand = 0x800;
  pParams->nPatsDyna = 0x800;
  pParams->nBTLimit = 99;
  pParams->nSeconds = 0x14;
  pParams->fFuncRed = 1;
  pParams->fFeedBack = 1;
  pParams->fDist1Pats = 1;
  pParams->fDoSparse = 0;
  pParams->fChoicing = 0;
  pParams->fTryProve = 1;
  pParams->fVerbose = 0;
  pParams->fVerboseP = 0;
  pParams->fInternal = 0;
  pParams->nConfLimit = 0;
  pParams->nInspLimit = 0;
  return;
}

Assistant:

void Fraig_ParamsSetDefault( Fraig_Params_t * pParams )
{
    memset( pParams, 0, sizeof(Fraig_Params_t) );
    pParams->nPatsRand  = FRAIG_PATTERNS_RANDOM;  // the number of words of random simulation info
    pParams->nPatsDyna  = FRAIG_PATTERNS_DYNAMIC; // the number of words of dynamic simulation info
    pParams->nBTLimit   = 99;                     // the max number of backtracks to perform
    pParams->nSeconds   = 20;                     // the max number of seconds to solve the miter
    pParams->fFuncRed   =  1;                     // performs only one level hashing
    pParams->fFeedBack  =  1;                     // enables solver feedback
    pParams->fDist1Pats =  1;                     // enables distance-1 patterns
    pParams->fDoSparse  =  0;                     // performs equiv tests for sparse functions 
    pParams->fChoicing  =  0;                     // enables recording structural choices
    pParams->fTryProve  =  1;                     // tries to solve the final miter
    pParams->fVerbose   =  0;                     // the verbosiness flag
    pParams->fVerboseP  =  0;                     // the verbose flag for reporting the proof
    pParams->fInternal  =  0;                     // the flag indicates the internal run 
    pParams->nConfLimit =  0;                     // the limit on the number of conflicts
    pParams->nInspLimit =  0;                     // the limit on the number of inspections
}